

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int bb_i2c_zip(int pi,uint SDA,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  undefined8 in_RDX;
  gpioExtent_t *in_R8;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fb0;
  int in_stack_00000fb4;
  void *in_stack_00000fb8;
  int in_stack_00000fc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 local_28;
  int in_stack_ffffffffffffffe8;
  
  local_28 = pigpio_command_ext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                in_stack_ffffffffffffffc8,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,0
                                ,in_R8,in_stack_ffffffffffffffe8);
  if (0 < local_28) {
    local_28 = recvMax(in_stack_00000fc4,in_stack_00000fb8,in_stack_00000fb4,in_stack_00000fb0);
  }
  _pmu(0);
  return local_28;
}

Assistant:

int bb_i2c_zip(
   int      pi,
   unsigned SDA,
   char    *inBuf,
   unsigned inLen,
   char    *outBuf,
   unsigned outLen)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=SDA
   p2=0
   p3=inLen
   ## extension ##
   char inBuf[inLen]
   */

   ext[0].size = inLen;
   ext[0].ptr = inBuf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_BI2CZ, SDA, 0, inLen, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, outBuf, outLen, bytes);
   }

   _pmu(pi);

   return bytes;
}